

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkAbsCreateLogic
               (Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins,
               Vec_Int_t *vNewObjs,Vec_Wec_t *vConstrs,Wlc_Obj_t *pConstrOut)

{
  Wlc_Obj_t *pWVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *p_01;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  Wlc_Obj_t *pWVar14;
  Wlc_Obj_t *pWVar15;
  Wlc_Obj_t *pWVar16;
  uint uVar17;
  Wlc_Obj_t *pWVar18;
  Wlc_Obj_t *pWVar19;
  Wlc_Obj_t *pWVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_00->pArray = piVar8;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar8 = (int *)malloc(400);
  p_01->pArray = piVar8;
  if (vNewObjs->nSize != vNodeFrames->nSize * 2) {
    __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x19f,
                  "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                 );
  }
  iVar12 = vConstrs->nSize;
  if (iVar12 < 1) {
LAB_0035e33d:
    uVar21 = Wlc_ObjAlloc(pNew,6,0,0,0);
    if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) {
LAB_0035e51a:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    piVar8 = vFanins->pArray;
    pWVar15 = pNew->pObjs + uVar21;
    if (vFanins->nCap < 1) {
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc(4);
      }
      else {
        piVar8 = (int *)realloc(piVar8,4);
      }
      vFanins->pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_0035e5b5;
      vFanins->nCap = 1;
    }
    *piVar8 = 0;
    vFanins->nSize = 1;
  }
  else {
    lVar23 = 0;
    do {
      pVVar4 = vConstrs->pArray;
      if (pVVar4[lVar23].nSize != 0) {
        if (pVVar4[lVar23].nSize < 2) {
          __assert_fail("Vec_IntSize(vTrace) >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x1a4,
                        "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                       );
        }
        p_01->nSize = 0;
        if ((long)pVVar4[lVar23].nSize < 1) goto LAB_0035e539;
        lVar9 = (long)vNodeFrames->nSize;
        if (lVar9 < 1) {
LAB_0035e558:
          __assert_fail("Index[0] >= 0 && Index[1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x1ac,
                        "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                       );
        }
        uVar21 = *pVVar4[lVar23].pArray;
        uVar10 = pVVar4[lVar23].pArray[(long)pVVar4[lVar23].nSize + -1];
        uVar11 = uVar10 >> 1 & 0x3ff;
        lVar13 = 0;
        do {
          if (vNodeFrames->pArray[lVar13] == uVar21) goto LAB_0035db0e;
          lVar13 = lVar13 + 1;
        } while (lVar9 != lVar13);
        lVar13 = 0xffffffff;
LAB_0035db0e:
        uVar22 = 0;
        while (*(uint *)((long)vNodeFrames->pArray + uVar22 * 2) != uVar10) {
          uVar22 = uVar22 + 2;
          lVar9 = lVar9 + -1;
          if (lVar9 == 0) goto LAB_0035e558;
        }
        iVar12 = (int)lVar13;
        if (iVar12 < 0) goto LAB_0035e558;
        uVar5 = iVar12 * 2;
        uVar10 = vNewObjs->nSize;
        if (uVar10 == uVar5 || SBORROW4(uVar10,uVar5) != (int)(uVar10 + iVar12 * -2) < 0) {
LAB_0035e539:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar8 = vNewObjs->pArray;
        iVar12 = piVar8[uVar5];
        if (((long)iVar12 < 1) || (uVar2 = pNew->nObjsAlloc, (int)uVar2 <= iVar12))
        goto LAB_0035e51a;
        if (uVar10 <= (uint)uVar22) goto LAB_0035e539;
        uVar3 = piVar8[uVar22 & 0xffffffff];
        if (((long)(int)uVar3 < 1) || (uVar2 <= uVar3)) goto LAB_0035e51a;
        if (uVar10 <= (uVar5 | 1)) goto LAB_0035e539;
        uVar5 = piVar8[uVar5 | 1];
        if (((long)(int)uVar5 < 1) || (uVar2 <= uVar5)) goto LAB_0035e51a;
        if (uVar10 <= (uint)(uVar22 + 1)) goto LAB_0035e539;
        uVar10 = piVar8[uVar22 + 1 & 0xffffffff];
        if (((long)(int)uVar10 < 1) || (uVar2 <= uVar10)) goto LAB_0035e51a;
        pWVar16 = pNew->pObjs;
        pWVar15 = pWVar16 + iVar12;
        pWVar14 = pWVar16 + (int)uVar5;
        if ((uVar21 >> 1 & 0x3ff) == uVar11) {
          if ((undefined1  [24])((undefined1  [24])*pWVar15 & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x3) goto LAB_0035e577;
          iVar12 = (pNew->vPis).nSize;
          iVar6 = (pNew->vPos).nSize;
          uVar21 = ((pWVar15->field_10).Fanins[1] + iVar6) - iVar12;
          if (((int)uVar21 < 0) || (uVar5 = (pNew->vCos).nSize, (int)uVar5 <= (int)uVar21))
          goto LAB_0035e539;
          piVar8 = (pNew->vCos).pArray;
          uVar21 = piVar8[uVar21];
          if (((long)(int)uVar21 < 1) || (uVar2 <= uVar21)) goto LAB_0035e51a;
          if ((undefined1  [24])((undefined1  [24])*pWVar14 & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x3) goto LAB_0035e577;
          uVar17 = (iVar6 - iVar12) + (pWVar14->field_10).Fanins[1];
          if (((int)uVar17 < 0) || (uVar5 <= uVar17)) goto LAB_0035e539;
          uVar5 = piVar8[uVar17];
          if (((long)(int)uVar5 < 1) || (uVar2 <= uVar5)) goto LAB_0035e51a;
          pWVar15 = pWVar16 + (int)uVar21;
          pWVar14 = pWVar16 + (int)uVar5;
        }
        if ((undefined1  [24])((undefined1  [24])pWVar16[(int)uVar3] & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x3) {
LAB_0035e577:
          __assert_fail("pObj->Type == WLC_OBJ_FO",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
        }
        iVar12 = (pNew->vPis).nSize;
        iVar6 = (pNew->vPos).nSize;
        uVar21 = (pWVar16[(int)uVar3].field_10.Fanins[1] + iVar6) - iVar12;
        if (((int)uVar21 < 0) || (uVar5 = (pNew->vCos).nSize, (int)uVar5 <= (int)uVar21))
        goto LAB_0035e539;
        piVar8 = (pNew->vCos).pArray;
        uVar21 = piVar8[uVar21];
        if (((long)(int)uVar21 < 1) || (uVar2 <= uVar21)) goto LAB_0035e51a;
        if ((undefined1  [24])((undefined1  [24])pWVar16[(int)uVar10] & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x3) goto LAB_0035e577;
        uVar10 = (iVar6 - iVar12) + pWVar16[(int)uVar10].field_10.Fanins[1];
        if (((int)uVar10 < 0) || (uVar5 <= uVar10)) goto LAB_0035e539;
        uVar10 = piVar8[uVar10];
        if (((long)(int)uVar10 < 1) ||
           (((uVar2 <= uVar10 || (uVar5 = Wlc_ObjAlloc(pNew,0x1f,0,0,0), (int)uVar5 < 1)) ||
            (pNew->nObjsAlloc <= (int)uVar5)))) goto LAB_0035e51a;
        pWVar20 = pNew->pObjs;
        piVar8 = vFanins->pArray;
        if (vFanins->nCap < 2) {
          if (piVar8 == (int *)0x0) {
            piVar8 = (int *)malloc(8);
          }
          else {
            piVar8 = (int *)realloc(piVar8,8);
          }
          vFanins->pArray = piVar8;
          if (piVar8 == (int *)0x0) goto LAB_0035e5b5;
          vFanins->nCap = 2;
        }
        pWVar1 = pWVar16 + (int)uVar21;
        pWVar19 = pWVar20 + uVar5;
        lVar9 = 0;
        do {
          pWVar18 = pWVar1;
          if (lVar9 == 0) {
            pWVar18 = pWVar15;
          }
          piVar8[lVar9] = (int)((ulong)((long)pWVar18 - (long)pWVar20) >> 3) * -0x55555555;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 2);
        vFanins->nSize = 2;
        Wlc_ObjAddFanins(pNew,pWVar19,vFanins);
        Vec_IntPush(p_01,(int)((ulong)((long)pWVar19 - (long)pNew->pObjs) >> 3) * -0x55555555);
        uVar21 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
        if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
        pWVar15 = pNew->pObjs;
        piVar8 = vFanins->pArray;
        if (vFanins->nCap < 2) {
          if (piVar8 == (int *)0x0) {
            piVar8 = (int *)malloc(8);
          }
          else {
            piVar8 = (int *)realloc(piVar8,8);
          }
          vFanins->pArray = piVar8;
          if (piVar8 == (int *)0x0) goto LAB_0035e5b5;
          vFanins->nCap = 2;
        }
        pWVar20 = pWVar15 + uVar21;
        lVar9 = 0;
        do {
          pWVar19 = pWVar16 + (int)uVar10;
          if (lVar9 == 0) {
            pWVar19 = pWVar14;
          }
          piVar8[lVar9] = (int)((ulong)((long)pWVar19 - (long)pWVar15) >> 3) * -0x55555555;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 2);
        vFanins->nSize = 2;
        Wlc_ObjAddFanins(pNew,pWVar20,vFanins);
        Vec_IntPush(p_01,(int)((ulong)((long)pWVar20 - (long)pNew->pObjs) >> 3) * -0x55555555);
        if (2 < pVVar4[lVar23].nSize) {
          lVar9 = 1;
          do {
            if ((long)vNodeFrames->nSize < 1) {
LAB_0035e4fb:
              __assert_fail("Index[0] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                            ,0x1cf,
                            "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                           );
            }
            uVar21 = pVVar4[lVar23].pArray[lVar9];
            uVar22 = 0;
            while (*(uint *)((long)vNodeFrames->pArray + uVar22 * 2) != uVar21) {
              uVar22 = uVar22 + 2;
              if ((long)vNodeFrames->nSize * 2 == uVar22) goto LAB_0035e4fb;
            }
            if (vNewObjs->nSize <= (int)uVar22) goto LAB_0035e539;
            iVar12 = vNewObjs->pArray[uVar22 & 0xffffffff];
            if (((long)iVar12 < 1) || (pNew->nObjsAlloc <= iVar12)) goto LAB_0035e51a;
            pWVar14 = pNew->pObjs;
            pWVar15 = pWVar14 + iVar12;
            if ((uVar21 >> 1 & 0x3ff) == uVar11) {
              if ((undefined1  [24])((undefined1  [24])*pWVar15 & (undefined1  [24])0x3f) !=
                  (undefined1  [24])0x3) goto LAB_0035e577;
              uVar10 = ((pWVar15->field_10).Fanins[1] + (pNew->vPos).nSize) - (pNew->vPis).nSize;
              if (((int)uVar10 < 0) || ((pNew->vCos).nSize <= (int)uVar10)) goto LAB_0035e539;
              uVar10 = (pNew->vCos).pArray[uVar10];
              if (((long)(int)uVar10 < 1) || ((uint)pNew->nObjsAlloc <= uVar10)) goto LAB_0035e51a;
              pWVar15 = pWVar14 + (int)uVar10;
            }
            if ((uint)vNewObjs->nSize <= (int)uVar22 + 1U) goto LAB_0035e539;
            if (vNewObjs->pArray[uVar22 + 1] == 0) {
              uVar21 = (int)uVar21 >> 0xb;
              if (((int)uVar21 < 1) || (p->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
              if ((undefined1  [24])((undefined1  [24])p->pObjs[uVar21] & (undefined1  [24])0x3f) !=
                  (undefined1  [24])0x8) {
                __assert_fail("Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x1d6,
                              "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                             );
              }
            }
            else {
              iVar6 = pWVar15->End - pWVar15->Beg;
              iVar12 = -iVar6;
              if (0 < iVar6) {
                iVar12 = iVar6;
              }
              iVar7 = pWVar1->End - pWVar1->Beg;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              if (iVar12 != iVar6) {
                __assert_fail("Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x1db,
                              "void Wlc_NtkAbsCreateLogic(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Wlc_Obj_t *)"
                             );
              }
              uVar21 = Wlc_ObjAlloc(pNew,0x20,0,0,0);
              if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
              pWVar14 = pNew->pObjs;
              piVar8 = vFanins->pArray;
              if (vFanins->nCap < 2) {
                if (piVar8 == (int *)0x0) {
                  piVar8 = (int *)malloc(8);
                }
                else {
                  piVar8 = (int *)realloc(piVar8,8);
                }
                vFanins->pArray = piVar8;
                if (piVar8 == (int *)0x0) goto LAB_0035e5b5;
                vFanins->nCap = 2;
              }
              pWVar16 = pWVar14 + uVar21;
              lVar13 = 0;
              do {
                pWVar20 = pWVar1;
                if (lVar13 == 0) {
                  pWVar20 = pWVar15;
                }
                piVar8[lVar13] = (int)((ulong)((long)pWVar20 - (long)pWVar14) >> 3) * -0x55555555;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 2);
              vFanins->nSize = 2;
              Wlc_ObjAddFanins(pNew,pWVar16,vFanins);
              pWVar14 = pNew->pObjs;
              pWVar15 = pWVar16;
            }
            Vec_IntPush(p_01,(int)((ulong)((long)pWVar15 - (long)pWVar14) >> 3) * -0x55555555);
            lVar9 = lVar9 + 1;
          } while (lVar9 < (long)pVVar4[lVar23].nSize + -1);
        }
        uVar21 = Wlc_ObjAlloc(pNew,0x17,0,p_01->nSize + -1,0);
        if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
        pWVar15 = pNew->pObjs;
        Wlc_ObjAddFanins(pNew,pWVar15 + uVar21,p_01);
        piVar8 = vFanins->pArray;
        pWVar14 = pNew->pObjs;
        if (vFanins->nCap < 1) {
          if (piVar8 == (int *)0x0) {
            piVar8 = (int *)malloc(4);
          }
          else {
            piVar8 = (int *)realloc(piVar8,4);
          }
          vFanins->pArray = piVar8;
          if (piVar8 == (int *)0x0) goto LAB_0035e5b5;
          vFanins->nCap = 1;
        }
        *piVar8 = (int)((ulong)((long)(pWVar15 + uVar21) - (long)pWVar14) >> 3) * -0x55555555;
        vFanins->nSize = 1;
        uVar21 = Wlc_ObjAlloc(pNew,0x25,0,0,0);
        if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
        pWVar15 = pNew->pObjs;
        Wlc_ObjAddFanins(pNew,pWVar15 + uVar21,vFanins);
        Vec_IntPush(p_00,(int)((ulong)((long)(pWVar15 + uVar21) - (long)pNew->pObjs) >> 3) *
                         -0x55555555);
        iVar12 = vConstrs->nSize;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < iVar12);
    if (p_00->nSize < 1) goto LAB_0035e33d;
    uVar21 = Wlc_ObjAlloc(pNew,0x17,0,p_00->nSize + -1,0);
    if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
    pWVar15 = pNew->pObjs;
    Wlc_ObjAddFanins(pNew,pWVar15 + uVar21,p_00);
    piVar8 = vFanins->pArray;
    pWVar14 = pNew->pObjs;
    if (vFanins->nCap < 1) {
      if (piVar8 == (int *)0x0) {
        piVar8 = (int *)malloc(4);
      }
      else {
        piVar8 = (int *)realloc(piVar8,4);
      }
      vFanins->pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_0035e5b5;
      vFanins->nCap = 1;
    }
    *piVar8 = (int)((ulong)((long)(pWVar15 + uVar21) - (long)pWVar14) >> 3) * -0x55555555;
    vFanins->nSize = 1;
    uVar21 = Wlc_ObjAlloc(pNew,0x26,0,0,0);
    if (((int)uVar21 < 1) || (pNew->nObjsAlloc <= (int)uVar21)) goto LAB_0035e51a;
    pWVar15 = pNew->pObjs + uVar21;
  }
  Wlc_ObjAddFanins(pNew,pWVar15,vFanins);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
  }
  free(p_01);
  pWVar14 = pNew->pObjs;
  piVar8 = vFanins->pArray;
  if (vFanins->nCap < 1) {
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc(4);
    }
    else {
      piVar8 = (int *)realloc(piVar8,4);
    }
    vFanins->pArray = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_0035e5b5:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFanins->nCap = 1;
  }
  *piVar8 = (int)((ulong)((long)pWVar15 - (long)pWVar14) >> 3) * -0x55555555;
  vFanins->nSize = 1;
  Wlc_ObjAddFanins(pNew,pConstrOut,vFanins);
  return;
}

Assistant:

void Wlc_NtkAbsCreateLogic( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins, Vec_Int_t * vNewObjs, Vec_Wec_t * vConstrs, Wlc_Obj_t * pConstrOut ) 
{
    Vec_Int_t * vTrace; 
    Vec_Int_t * vBitConstr = Vec_IntAlloc( 100 );
    Vec_Int_t * vLevConstr = Vec_IntAlloc( 100 );
    Wlc_Obj_t * pAddrs[2], * pDatas[2], * pCond, * pConstr = NULL;
    int i, k, Entry, Index[2], iFrameLast, iFrameThis;
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    Vec_WecForEachLevel( vConstrs, vTrace, i )
    {
        if ( Vec_IntSize(vTrace) == 0 ) 
            continue;
        assert( Vec_IntSize(vTrace) >= 2 );
        Vec_IntClear( vLevConstr );

        iFrameThis = (Vec_IntEntry(vTrace, 0)  >> 1) & 0x3FF;
        iFrameLast = (Vec_IntEntryLast(vTrace) >> 1) & 0x3FF;

        Index[0] = Vec_IntFind( vNodeFrames, Vec_IntEntry(vTrace, 0) );
        Index[1] = Vec_IntFind( vNodeFrames, Vec_IntEntryLast(vTrace) );
        assert( Index[0] >= 0 && Index[1] >= 0 );

        pAddrs[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
        pAddrs[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]) );

        pDatas[0] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]+1) );
        pDatas[1] = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[1]+1) );

        // redirect the source in the last time frame to point to FOs
        if ( iFrameThis == iFrameLast )
        {
            pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            pDatas[0] = Wlc_ObjFo2Fi(pNew, pDatas[0]);
        }

        // redirect the sink in the last time frame to point to FOs
        pAddrs[1] = Wlc_ObjFo2Fi(pNew, pAddrs[1]);
        pDatas[1] = Wlc_ObjFo2Fi(pNew, pDatas[1]);

        // equal addresses
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_EQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        // different datas
        pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
        Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pDatas[0]), Wlc_ObjId(pNew, pDatas[1]) );
        Wlc_ObjAddFanins( pNew, pCond, vFanins );
        Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );

        Vec_IntForEachEntryStartStop( vTrace, Entry, k, 1, Vec_IntSize(vTrace)-1 )
        {
            iFrameThis = (Entry >> 1) & 0x3FF;
            Index[0]   = Vec_IntFind( vNodeFrames, Entry );            
            assert( Index[0] >= 0 );
            pAddrs[0]  = Wlc_NtkObj( pNew, Vec_IntEntry(vNewObjs, 2*Index[0]) );
            // redirect the middle in the last time frame to point to FOs
            if ( iFrameThis == iFrameLast )
                pAddrs[0] = Wlc_ObjFo2Fi(pNew, pAddrs[0]);
            if ( Vec_IntEntry(vNewObjs, 2*Index[0]+1) == 0 ) // MUX
            {
                assert( Wlc_ObjType(Wlc_NtkObj(p, Entry >> 11)) == WLC_OBJ_MUX );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pAddrs[0]) );
            }
            else // different addresses
            {
                assert( Wlc_ObjRange(pAddrs[0]) == Wlc_ObjRange(pAddrs[1]) );
                pCond = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_COMP_NOTEQU, 0, 0, 0));
                Vec_IntFillTwo( vFanins, 2, Wlc_ObjId(pNew, pAddrs[0]), Wlc_ObjId(pNew, pAddrs[1]) );
                Wlc_ObjAddFanins( pNew, pCond, vFanins );
                Vec_IntPush( vLevConstr, Wlc_ObjId(pNew, pCond) );
            }
        }

        // create last output
        pConstr = Wlc_NtkObj( pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vLevConstr)-1, 0) );
        Wlc_ObjAddFanins( pNew, pConstr, vLevConstr );
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_AND, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );

        // save the result
        Vec_IntPush( vBitConstr, Wlc_ObjId(pNew, pConstr) );
    }
    if ( Vec_IntSize(vBitConstr) > 0 )
    {
        // create last output
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vBitConstr)-1, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vBitConstr );
        // create last output
        Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_REDUCT_OR, 0, 0, 0));
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    else
    {
        pConstr = Wlc_NtkObj(pNew, Wlc_ObjAlloc(pNew, WLC_OBJ_CONST, 0, 0, 0));
        Vec_IntFill( vFanins, 1, 0 ); // const0 - always true
        Wlc_ObjAddFanins( pNew, pConstr, vFanins );
    }
    // cleanup
    Vec_IntFree( vBitConstr );
    Vec_IntFree( vLevConstr );
    // add the constraint as fanin to the output
    Vec_IntFill( vFanins, 1, Wlc_ObjId(pNew, pConstr) );
    Wlc_ObjAddFanins( pNew, pConstrOut, vFanins );
}